

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O0

int ffgcll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int nultyp,
          char nulval,char *array,char *nularray,int *anynul,int *status)

{
  int iVar1;
  LONGLONG LVar2;
  long local_7268;
  long local_7260;
  uchar **local_7220;
  uchar *buffptr;
  uchar buffer [28800];
  char snull [20];
  char local_178 [8];
  char message [81];
  char local_118 [8];
  char tform [20];
  double local_f8;
  double zero;
  double scale;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  long ntodo;
  long incre;
  long twidth;
  int local_80;
  int nulcheck;
  int ii;
  int hdutype;
  int maxelem;
  int tcode;
  double dtemp;
  LONGLONG LStack_60;
  int nultyp_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  fitsfile *pfStack_40;
  int colnum_local;
  fitsfile *fptr_local;
  
  if ((*status < 1) && (nelem != 0)) {
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    dtemp._4_4_ = nultyp;
    LStack_60 = nelem;
    nelem_local = firstelem;
    firstelem_local = firstrow;
    firstrow_local._4_4_ = colnum;
    pfStack_40 = fptr;
    if (nultyp == 2) {
      memset(nularray,0,nelem);
    }
    iVar1 = ffgcprll(pfStack_40,firstrow_local._4_4_,firstelem_local,nelem_local,LStack_60,0,&zero,
                     &local_f8,local_118,&incre,&hdutype,&ii,&elemnum,&readptr,&ntodo,&startpos,
                     &rownum,&nulcheck,&rowlen,(char *)(buffer + 0x7078),status);
    if (iVar1 < 1) {
      if (hdutype == 0xe) {
        twidth._4_4_ = dtemp._4_4_;
        if ((dtemp._4_4_ == 1) && (nulval == '\0')) {
          twidth._4_4_ = 0;
        }
        scale = 0.0;
        remain = 0;
        repeat = LStack_60;
        LVar2 = repeat;
        while (repeat = LVar2, next = repeat, repeat != 0) {
          if (repeat < ii) {
            local_7260 = repeat;
          }
          else {
            local_7260 = (long)ii;
          }
          if (local_7260 < startpos - readptr) {
            local_7268 = local_7260;
          }
          else {
            local_7268 = startpos - readptr;
          }
          repeat = local_7268;
          tnull = elemnum + rownum * remain + readptr * ntodo;
          ffgi1b(pfStack_40,tnull,local_7268,ntodo,(uchar *)&buffptr,status);
          local_7220 = &buffptr;
          for (local_80 = 0; local_80 < repeat; local_80 = local_80 + 1) {
            if (*(char *)local_7220 == 'T') {
              array[(long)scale] = '\x01';
            }
            else if (*(char *)local_7220 == 'F') {
              array[(long)scale] = '\0';
            }
            else if (*(char *)local_7220 == '\0') {
              array[(long)scale] = nulval;
              if (anynul != (int *)0x0) {
                *anynul = 1;
              }
              if (twidth._4_4_ == 2) {
                nularray[(long)scale] = '\x01';
              }
            }
            else if (*(char *)local_7220 == '\x01') {
              array[(long)scale] = '1';
            }
            else {
              array[(long)scale] = *(char *)local_7220;
            }
            scale = (double)((long)scale + 1);
            local_7220 = (uchar **)((long)local_7220 + 1);
          }
          if (0 < *status) {
            _maxelem = (double)(long)scale;
            snprintf(local_178,0x51,
                     "Error reading elements %.0f thruough %.0f of logical array (ffgcl).",
                     _maxelem + 1.0,_maxelem + (double)repeat);
            ffpmsg(local_178);
            return *status;
          }
          LVar2 = next - repeat;
          if ((LVar2 != 0) && (readptr = repeat + readptr, readptr == startpos)) {
            readptr = 0;
            remain = remain + 1;
          }
        }
        fptr_local._4_4_ = *status;
      }
      else {
        *status = 0x136;
        fptr_local._4_4_ = 0x136;
      }
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcll( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG  firstelem, /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            char nulval,      /* I - value for null pixels if nultyp = 1     */
            char *array,      /* O - array of values                         */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of logical values from a column in the current FITS HDU.
*/
{
    double dtemp;
    int tcode, maxelem, hdutype, ii, nulcheck;
    long twidth, incre;
    long ntodo;
    LONGLONG repeat, startpos, elemnum, readptr, tnull, rowlen, rownum, remain, next;
    double scale, zero;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    unsigned char buffer[DBUFFSIZE], *buffptr;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    if (anynul)
       *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 0, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode != TLOGICAL)   
        return(*status = NOT_LOGICAL_COL);
 
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    /*---------------------------------------------------------------------*/
    /*  Now read the logical values from the FITS column.                  */
    /*---------------------------------------------------------------------*/

    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */
    ntodo = (long) remain;           /* max number of elements to read at one time */

    while (ntodo)
    {
      /*
         limit the number of pixels to read at one time to the number that
         remain in the current vector.    
      */
      ntodo = (long) minvalue(ntodo, maxelem);      
      ntodo = (long) minvalue(ntodo, (repeat - elemnum));

      readptr = startpos + (rowlen * rownum) + (elemnum * incre);

      ffgi1b(fptr, readptr, ntodo, incre, buffer, status);

      /* convert from T or F to 1 or 0 */
      buffptr = buffer;
      for (ii = 0; ii < ntodo; ii++, next++, buffptr++)
      {
        if (*buffptr == 'T')
          array[next] = 1;
        else if (*buffptr =='F') 
          array[next] = 0;
        else if (*buffptr == 0)
        {
          array[next] = nulval;  /* set null values to input nulval */
          if (anynul)
              *anynul = 1;

          if (nulcheck == 2)
          {
            nularray[next] = 1;  /* set null flags */
          }
        }
        else  /* some other illegal character; return the char value */
        {
          if (*buffptr == 1) {
            /* this is an unfortunate case where the illegal value is the same
               as what we set True values to, so set the value to the character '1'
               instead, which has ASCII value 49.  */
            array[next] = 49;
          } else {
            array[next] = (char) *buffptr;
          }
        }
      }

      if (*status > 0)  /* test for error during previous read operation */
      {
	dtemp = (double) next;
        snprintf(message,FLEN_ERRMSG,
          "Error reading elements %.0f thruough %.0f of logical array (ffgcl).",
           dtemp+1., dtemp + ntodo);
        ffpmsg(message);
        return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      remain -= ntodo;
      if (remain)
      {
        elemnum += ntodo;

        if (elemnum == repeat)  /* completed a row; start on later row */
          {
            elemnum = 0;
            rownum++;
          }
      }
      ntodo = (long) remain;  /* this is the maximum number to do in next loop */

    }  /*  End of main while Loop  */

    return(*status);
}